

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# migrate.cpp
# Opt level: O1

void __thiscall wallet::OverflowRecord::Unserialize<AutoFile>(OverflowRecord *this,AutoFile *s)

{
  uint uVar1;
  size_t in_RCX;
  long in_FS_OFFSET;
  uint8_t obj;
  uint32_t local_24;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  AutoFile::read(s,(int)&local_24,(void *)0x1,in_RCX);
  this->unused2 = (uint8_t)local_24;
  AutoFile::read(s,(int)&local_24,(void *)0x4,in_RCX);
  this->page_number = local_24;
  AutoFile::read(s,(int)&local_24,(void *)0x4,in_RCX);
  this->item_len = local_24;
  if ((this->m_header).other_endian == true) {
    uVar1 = this->page_number;
    this->page_number =
         uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    this->item_len =
         local_24 >> 0x18 | (local_24 & 0xff0000) >> 8 | (local_24 & 0xff00) << 8 | local_24 << 0x18
    ;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Unserialize(Stream& s)
    {
        s >> unused2;
        s >> page_number;
        s >> item_len;

        if (m_header.other_endian) {
            page_number = internal_bswap_32(page_number);
            item_len = internal_bswap_32(item_len);
        }
    }